

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBuiltInsAtDefinition
          (BuiltInsValidator *this)

{
  Decoration *decoration;
  BuiltInsValidator *pBVar1;
  _Rb_tree_color _Var2;
  bool bVar3;
  spv_result_t sVar4;
  int32_t iVar5;
  StorageClass SVar6;
  Instruction *inst;
  ValidationState_t *pVVar7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  DiagnosticStream *pDVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  undefined4 uVar13;
  uint32_t uVar14;
  spv_operand_desc psVar15;
  long lVar16;
  Instruction *pIVar17;
  Instruction *inst_00;
  _Any_data *p_Var18;
  uint32_t vuid;
  uint32_t num_cols;
  uint32_t col_type;
  uint32_t underlying_type;
  uint32_t component_type;
  uint32_t num_rows;
  ostringstream ss;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  code *local_280;
  code *local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [28];
  spv_ext_inst_type_t sStack_234;
  Extension *local_230;
  spv_parsed_operand_t *local_228 [2];
  _Any_data local_218;
  undefined1 local_208 [96];
  ios_base local_1a8 [352];
  spv_result_t local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  p_Var12 = (this->_->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->_->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var12 != local_38) {
    do {
      local_40 = p_Var12;
      if (p_Var12[2]._M_left != (_Base_ptr)0x0) {
        inst = ValidationState_t::FindDef(this->_,p_Var12[1]._M_color);
        if (inst == (Instruction *)0x0) {
          __assert_fail("inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                        ,0x119a,
                        "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateBuiltInsAtDefinition()"
                       );
        }
        for (p_Var8 = *(_Rb_tree_node_base **)(p_Var12 + 2);
            p_Var8 != (_Rb_tree_node_base *)&p_Var12[1]._M_left;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          if (p_Var8[1]._M_color != 0xb) goto switchD_002a18c0_caseD_14a8;
          _Var2 = (p_Var8[1]._M_parent)->_M_color;
          bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
          if (!bVar3) goto switchD_002a18c0_caseD_14a8;
          decoration = (Decoration *)(p_Var8 + 1);
          if (0x1395 < (int)_Var2) {
            if ((int)_Var2 < 0x14e7) {
              switch(_Var2) {
              case 0x14a6:
              case 0x14a7:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                  _Var2 = (p_Var8[1]._M_parent)->_M_color;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                  local_208._8_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2895:13)>
                       ::_M_invoke;
                  local_208._0_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2895:13)>
                       ::_M_manager;
                  sVar4 = ValidateF32Vec(this,decoration,inst,3,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                    (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                  }
                  if (sVar4 != SPV_SUCCESS) {
                    return sVar4;
                  }
                }
                sVar4 = ValidateFragmentShaderF32Vec3InputAtReference
                                  (this,decoration,inst,inst,inst);
                break;
              case 0x14a8:
              case 0x14a9:
              case 0x14aa:
              case 0x14ab:
              case 0x14b1:
              case 0x14b2:
              case 0x14b3:
              case 0x14b4:
              case 0x14b5:
              case 0x14b6:
              case 0x14b7:
              case 0x14b8:
              case 0x14b9:
              case 0x14ba:
              case 0x14bb:
              case 0x14bc:
              case 0x14bd:
              case 0x14be:
              case 0x14bf:
              case 0x14c0:
              case 0x14c1:
              case 0x14c2:
              case 0x14c3:
              case 0x14c4:
              case 0x14c5:
              case 0x14c6:
              case 0x14d0:
              case 0x14d1:
                goto switchD_002a18c0_caseD_14a8;
              case 0x14ac:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                  local_2b0._0_4_ = (p_Var8[1]._M_parent)->_M_color;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  *(undefined1 **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header = local_2b0;
                  local_208._8_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3618:13)>
                       ::_M_invoke;
                  local_208._0_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3618:13)>
                       ::_M_manager;
                  sVar4 = ValidateI32Vec(this,decoration,inst,2,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                    (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                  }
                  if (sVar4 != SPV_SUCCESS) {
                    return sVar4;
                  }
                }
                sVar4 = ValidateFragSizeAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14ad:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                  local_2b0._0_4_ = (p_Var8[1]._M_parent)->_M_color;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  *(undefined1 **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header = local_2b0;
                  local_208._8_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3548:13)>
                       ::_M_invoke;
                  local_208._0_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3548:13)>
                       ::_M_manager;
                  sVar4 = ValidateI32(this,decoration,inst,
                                      (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                       *)&local_218);
                  if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                    (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                  }
                  if (sVar4 != SPV_SUCCESS) {
                    return sVar4;
                  }
                }
                sVar4 = ValidateFragInvocationCountAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14ae:
              case 0x14af:
              case 0x14b0:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                  _Var2 = (p_Var8[1]._M_parent)->_M_color;
                  lVar16 = 0;
                  do {
                    if (*(_Rb_tree_color *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar16)
                        == _Var2) {
                      uVar13 = *(undefined4 *)(&UNK_00352af0 + lVar16);
                      goto LAB_002a2654;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while (lVar16 != 0x270);
                  uVar13 = 0;
LAB_002a2654:
                  local_2b0._0_4_ = uVar13;
                  if (_Var2 == 0x14b0) {
                    local_218._8_8_ = (Instruction *)0x0;
                    local_218._M_unused._M_object = operator_new(0x20);
                    ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                    *(Instruction **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl = inst;
                    *(Decoration **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                    (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b0;
                    local_208._8_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4233:15)>
                         ::_M_invoke;
                    local_208._0_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4233:15)>
                         ::_M_manager;
                    uVar14 = 3;
LAB_002a35cb:
                    sVar4 = ValidateArrayedI32Vec
                                      (this,decoration,inst,uVar14,
                                       (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        *)&local_218);
                  }
                  else {
                    if (_Var2 == 0x14af) {
                      local_218._8_8_ = (Instruction *)0x0;
                      local_218._M_unused._M_object = operator_new(0x20);
                      ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ =
                           (ValidationState_t *)this;
                      *(Instruction **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl = inst;
                      *(Decoration **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl.super__Rb_tree_header._M_header =
                           decoration;
                      (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b0
                      ;
                      local_208._8_8_ =
                           std::
                           _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4214:15)>
                           ::_M_invoke;
                      local_208._0_8_ =
                           std::
                           _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4214:15)>
                           ::_M_manager;
                      uVar14 = 2;
                      goto LAB_002a35cb;
                    }
                    if (_Var2 != 0x14ae) goto LAB_002a35f9;
                    local_218._8_8_ = (Instruction *)0x0;
                    local_218._M_unused._M_object = operator_new(0x20);
                    ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                    *(Instruction **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl = inst;
                    *(Decoration **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                    (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b0;
                    local_208._8_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4196:15)>
                         ::_M_invoke;
                    local_208._0_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4196:15)>
                         ::_M_manager;
                    sVar4 = ValidateI32Arr(this,decoration,inst,
                                           (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                            *)&local_218);
                  }
                  if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                    (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                  }
                  if (sVar4 != SPV_SUCCESS) {
                    return sVar4;
                  }
                }
LAB_002a35f9:
                sVar4 = ValidateMeshShadingEXTBuiltinsAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14c7:
              case 0x14c8:
              case 0x14c9:
              case 0x14ca:
              case 0x14cb:
              case 0x14cc:
              case 0x14cd:
              case 0x14ce:
              case 0x14cf:
              case 0x14d2:
              case 0x14d3:
              case 0x14d4:
              case 0x14d5:
                goto switchD_002a18c0_caseD_14c7;
              default:
                if (_Var2 == 0x1396) {
                  bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                  if (bVar3) {
                    if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                    local_250._24_4_ = (p_Var8[1]._M_parent)->_M_color;
                    local_290._8_8_ = 0;
                    local_290._0_8_ = operator_new(0x18);
                    *(BuiltInsValidator **)local_290._0_8_ = this;
                    *(Instruction **)(local_290._0_8_ + 8) = inst;
                    *(undefined1 **)(local_290._0_8_ + 0x10) = local_250 + 0x18;
                    local_278 = std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3688:13)>
                                ::_M_invoke;
                    local_280 = std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3688:13)>
                                ::_M_manager;
                    local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
                    pIVar17 = (Instruction *)local_260;
                    sVar4 = GetUnderlyingType(this->_,(Decoration *)(ulong)p_Var8[2]._M_color,inst,
                                              (uint32_t *)pIVar17);
                    if (sVar4 == SPV_SUCCESS) {
                      bVar3 = ValidationState_t::IsIntScalarType(this->_,local_260._0_4_);
                      sVar4 = SPV_SUCCESS;
                      if (!bVar3) {
                        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                                  ((string *)local_2b0,decoration,(Decoration *)inst,pIVar17);
                        plVar9 = (long *)std::__cxx11::string::append((char *)local_2b0);
                        local_218._M_unused._M_object = local_208;
                        pBVar1 = (BuiltInsValidator *)(plVar9 + 2);
                        if ((BuiltInsValidator *)*plVar9 == pBVar1) {
                          local_208._0_8_ = pBVar1->_;
                          local_208._8_8_ = plVar9[3];
                        }
                        else {
                          local_208._0_8_ = pBVar1->_;
                          local_218._M_unused._M_object = (BuiltInsValidator *)*plVar9;
                        }
                        local_218._8_8_ = plVar9[1];
                        *plVar9 = (long)pBVar1;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        if ((ValidationState_t *)local_280 == (ValidationState_t *)0x0)
                        goto LAB_002a3ffd;
                        sVar4 = (*local_278)(local_290,&local_218);
                        if ((BuiltInsValidator *)local_218._M_unused._0_8_ !=
                            (BuiltInsValidator *)local_208) {
                          operator_delete(local_218._M_unused._M_object,
                                          (ulong)((long)(spv_const_context *)local_208._0_8_ + 1));
                        }
                        if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)local_2a0) {
                          operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
                        }
                      }
                    }
                    if ((ValidationState_t *)local_280 != (ValidationState_t *)0x0) {
                      (*local_280)(local_290,local_290,3);
                    }
                    if (sVar4 != SPV_SUCCESS) {
                      return sVar4;
                    }
                  }
                  sVar4 = ValidateFragStencilRefAtReference(this,decoration,inst,inst,inst);
                }
                else {
                  if (_Var2 != 0x1490) goto switchD_002a18c0_caseD_14a8;
                  bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                  if (bVar3) {
                    if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                    local_2b0._0_4_ = (p_Var8[1]._M_parent)->_M_color;
                    local_218._8_8_ = (Instruction *)0x0;
                    local_218._M_unused._M_object = operator_new(0x18);
                    ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                    *(Instruction **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl = inst;
                    *(undefined1 **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header = local_2b0;
                    local_208._8_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3758:13)>
                         ::_M_invoke;
                    local_208._0_8_ =
                         std::
                         _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3758:13)>
                         ::_M_manager;
                    sVar4 = ValidateBool(this,decoration,inst,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                    if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                      (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                    }
                    if (sVar4 != SPV_SUCCESS) {
                      return sVar4;
                    }
                  }
                  sVar4 = ValidateFullyCoveredAtReference(this,decoration,inst,inst,inst);
                }
              }
              goto LAB_002a2435;
            }
            if (_Var2 - 0x14fe < 4) {
LAB_002a1c07:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3827:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3827:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateNVSMOrARMCoreBuiltinsAtReference(this,decoration,inst,inst,inst);
              goto LAB_002a2435;
            }
            if ((_Var2 - 0x14e7 < 2) || (_Var2 == 0x1785)) goto switchD_002a18c0_caseD_14c7;
            goto switchD_002a18c0_caseD_14a8;
          }
          switch(_Var2) {
          case _S_red:
            sVar4 = ValidatePositionAtReference(this,decoration,inst,inst,inst);
            break;
          case _S_black:
            sVar4 = ValidatePointSizeAtReference(this,decoration,inst,inst,inst);
            break;
          case 2:
          case 0x15:
          case 0x1e:
          case 0x1f:
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x25:
          case 0x27:
            goto switchD_002a18c0_caseD_14a8;
          case 3:
          case 4:
            sVar4 = ValidateClipOrCullDistanceAtReference(this,decoration,inst,inst,inst);
            break;
          case 5:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,
                         "Vulkan spec doesn\'t allow BuiltIn VertexId to be used.",0x36);
              sVar4 = local_48;
LAB_002a3654:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
              break;
            }
            goto switchD_002a18c0_caseD_14a8;
          case 6:
switchD_002a18c0_caseD_14c7:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) {
LAB_002a3fa0:
                __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                              ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
              }
              _Var2 = (p_Var8[1]._M_parent)->_M_color;
              switch(_Var2) {
              case 0x14c7:
              case 0x14c8:
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4093:17)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4093:17)>
                     ::_M_manager;
                sVar4 = ValidateI32Vec(this,decoration,inst,3,
                                       (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        *)&local_218);
                break;
              case 0x14c9:
              case 0x14ca:
              case 0x14cb:
              case 0x14cc:
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4073:17)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4073:17)>
                     ::_M_manager;
                sVar4 = ValidateF32Vec(this,decoration,inst,3,
                                       (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        *)&local_218);
                break;
              case 0x14cd:
              case 0x14ce:
              case 0x14d4:
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4029:17)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4029:17)>
                     ::_M_manager;
                sVar4 = ValidateF32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                break;
              case 0x14d0:
              case 0x14d1:
              case 0x14d6:
              case 0x14d7:
              case 0x14d8:
              case 0x14d9:
              case 0x14da:
              case 0x14db:
              case 0x14dc:
              case 0x14dd:
              case 0x14de:
              case 0x14df:
              case 0x14e0:
              case 0x14e1:
              case 0x14e2:
              case 0x14e3:
              case 0x14e4:
              case 0x14e5:
              case 0x14e6:
switchD_002a190c_caseD_14d0:
                __assert_fail("0 && \"Unexpected ray tracing builtin\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                              ,0x1022,
                              "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateRayTracingBuiltinsAtDefinition(const Decoration &, const Instruction &)"
                             );
              case 0x14d2:
              case 0x14d3:
                local_290._8_8_ = 0;
                local_290._0_8_ = operator_new(0x18);
                *(BuiltInsValidator **)local_290._0_8_ = this;
                *(Instruction **)(local_290._0_8_ + 8) = inst;
                *(_Rb_tree_color *)(local_290._0_8_ + 0x10) = _Var2;
                local_278 = std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4113:17)>
                            ::_M_invoke;
                local_280 = std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4113:17)>
                            ::_M_manager;
                local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
                local_250._24_4_ = _S_red;
                local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
                local_270._12_4_ = SPV_OPERAND_TYPE_NONE;
                local_250._20_4_ = SPV_OPERAND_TYPE_NONE;
                sVar4 = GetUnderlyingType(this->_,(Decoration *)(ulong)p_Var8[2]._M_color,inst,
                                          (uint32_t *)local_260);
                if (sVar4 == SPV_SUCCESS) {
                  pIVar17 = (Instruction *)local_270;
                  bVar3 = ValidationState_t::GetMatrixTypeInfo
                                    (this->_,local_260._0_4_,(uint32_t *)(local_250 + 0x18),
                                     (uint32_t *)pIVar17,(uint32_t *)(local_270 + 0xc),
                                     (uint32_t *)(local_250 + 0x14));
                  if (((bVar3) && (local_250._24_4_ == 3)) &&
                     (local_270._0_4_ == SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID)) {
                    sVar4 = ValidateF32VecHelper
                                      (this,decoration,inst,3,
                                       (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        *)local_290,local_270._12_4_);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream
                              ((ostringstream *)local_218._M_pod_data);
                    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                              ((string *)local_2b0,decoration,(Decoration *)inst,pIVar17);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_218._M_pod_data,(char *)local_2b0._0_8_,
                                         local_2b0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," has columns ",0xd);
                    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," and rows ",10);
                    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11," not equal to expected ",0x17);
                    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
                    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
                    if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)local_2a0) {
                      operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
                    }
                    std::__cxx11::stringbuf::str();
                    if ((ValidationState_t *)local_280 == (ValidationState_t *)0x0) {
LAB_002a3ffd:
                      std::__throw_bad_function_call();
                    }
                    sVar4 = (*local_278)(local_290,local_2b0);
                    if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)local_2a0) {
                      operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream
                              ((ostringstream *)local_218._M_pod_data);
                    std::ios_base::~ios_base(local_1a8);
                  }
                }
                if ((ValidationState_t *)local_280 != (ValidationState_t *)0x0) {
                  p_Var18 = (_Any_data *)local_290;
                  pVVar7 = (ValidationState_t *)local_280;
                  goto LAB_002a240c;
                }
                goto LAB_002a2413;
              default:
                if ((_Var2 != 6) && (_Var2 != 0x1785)) goto switchD_002a190c_caseD_14d0;
              case 0x14cf:
              case 0x14d5:
              case 0x14e7:
              case 0x14e8:
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4052:17)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4052:17)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
              }
              p_Var18 = &local_218;
              pVVar7 = (ValidationState_t *)local_208._0_8_;
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
LAB_002a240c:
                (*(code *)pVVar7)(p_Var18,p_Var18,3);
              }
LAB_002a2413:
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateRayTracingBuiltinsAtReference(this,decoration,inst,inst,inst);
            break;
          case 7:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (p_Var8[2]._M_color == ~_S_red) {
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2147:15)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2147:15)>
                     ::_M_manager;
                local_218._M_unused._M_object = this;
                local_218._8_8_ = inst;
                sVar4 = ValidateOptionalArrayedI32
                                  (this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              }
              else {
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2135:15)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2135:15)>
                     ::_M_manager;
                local_218._M_unused._M_object = this;
                local_218._8_8_ = inst;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
              }
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidatePrimitiveIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 8:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1637:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1637:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateInvocationIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 9:
          case 10:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (p_Var8[2]._M_color == ~_S_red) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = decoration;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = inst;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2752:15)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2752:15)>
                     ::_M_manager;
                sVar4 = ValidateOptionalArrayedI32
                                  (this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              }
              else {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = decoration;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = inst;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2734:15)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2734:15)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
              }
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateLayerOrViewportIndexAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xb:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2512:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2512:13)>
                   ::_M_manager;
              uVar14 = 4;
LAB_002a2df3:
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32Arr(this,decoration,inst,uVar14,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            goto LAB_002a2e22;
          case 0xc:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2533:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2533:13)>
                   ::_M_manager;
              uVar14 = 2;
              goto LAB_002a2df3;
            }
LAB_002a2e22:
            sVar4 = ValidateTessLevelAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xd:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2452:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2452:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateTessCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xe:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1758:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1758:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidatePatchVerticesAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xf:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1378:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1378:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32Vec(this,decoration,inst,4,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateFragCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x10:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1819:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1819:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32Vec(this,decoration,inst,2,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidatePointCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x11:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1516:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1516:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateBool(this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateFrontFacingAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x12:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2270:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2270:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateSampleIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x13:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2390:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2390:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32Vec(this,decoration,inst,2,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateSamplePositionAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x14:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2329:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2329:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32Arr(this,decoration,inst,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateSampleMaskAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x16:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1440:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1440:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateF32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateFragDepthAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x17:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1577:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1577:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateBool(this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateHelperInvocationAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x18:
          case 0x1a:
          case 0x1b:
          case 0x1c:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
              _Var2 = (p_Var8[1]._M_parent)->_M_color;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2969:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2969:13)>
                   ::_M_manager;
              sVar4 = ValidateI32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateComputeShaderI32Vec3InputAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x19:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if ((bVar3) && (iVar5 = spvOpcodeIsConstant((uint)(inst->inst_).opcode), iVar5 == 0))
              {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)local_2b0,this->_,0x114a,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2b0._0_8_,local_2b0._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,
                           "Vulkan spec requires BuiltIn WorkgroupSize to be a constant. ",0x3d);
                (anonymous_namespace)::GetIdDesc_abi_cxx11_
                          ((string *)local_290,(_anonymous_namespace_ *)inst,inst_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_290._0_8_,local_290._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," is not a constant.",0x13);
                sVar4 = local_48;
LAB_002a3f31:
                if ((code **)local_290._0_8_ != &local_280) {
                  operator_delete((void *)local_290._0_8_,(ulong)((long)local_280 + 1));
                }
                if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
                }
                goto LAB_002a3654;
              }
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3230:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3230:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateWorkgroupSizeAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x1d:
            ValidateLocalInvocationIndexAtReference
                      (this,decoration,inst,(Instruction *)&switchD_002a1993::switchdataD_003525f0,
                       inst);
            goto switchD_002a18c0_caseD_14a8;
          case 0x24:
          case 0x29:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
              _Var2 = (p_Var8[1]._M_parent)->_M_color;
              if (p_Var8[2]._M_color != ~_S_red) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                local_2b0._0_8_ = (spv_operand_desc)0x0;
                sVar4 = AssemblyGrammar::lookupOperand
                                  (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                   (spv_operand_desc *)local_2b0);
LAB_002a200d:
                if ((spv_operand_desc)local_2b0._0_8_ == (spv_operand_desc)0x0 ||
                    sVar4 != SPV_SUCCESS) {
                  local_2b0._0_8_ = "Unknown";
                }
                else {
                  local_2b0._0_8_ = ((spv_operand_desc)local_2b0._0_8_)->name;
                }
                pDVar10 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar10," cannot be used as a member decoration ",0x27);
                sVar4 = pDVar10->error_;
                goto LAB_002a3654;
              }
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3140:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3140:13)>
                   ::_M_manager;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
              SVar6 = GetStorageClass((anon_unknown_0 *)
                                      (inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (Instruction *)(ulong)(inst->inst_).opcode);
              if ((SVar6 != Input) && (SVar6 != Max)) {
                lVar16 = 8;
                do {
                  if (*(_Rb_tree_color *)((long)&UINT_00352adc + lVar16) == _Var2) {
                    uVar14 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar16);
                    goto LAB_002a3ccd;
                  }
                  lVar16 = lVar16 + 0x10;
                } while (lVar16 != 0x278);
                uVar14 = 0;
LAB_002a3ccd:
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)local_2b0,this->_,uVar14,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2b0._0_8_,local_2b0._8_8_)
                ;
                spvLogStringForEnv_abi_cxx11_((string *)local_290,this->_->context_->target_env);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_290._0_8_,local_290._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," spec allows BuiltIn ",0x15);
                local_260._0_8_ = (spv_operand_desc)0x0;
                sVar4 = AssemblyGrammar::lookupOperand
                                  (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                   (spv_operand_desc *)local_260);
                if ((spv_operand_desc)local_260._0_8_ == (spv_operand_desc)0x0 ||
                    sVar4 != SPV_SUCCESS) {
                  local_270._0_8_ = "Unknown";
                }
                else {
                  local_270._0_8_ = *(undefined8 *)local_260._0_8_;
                }
                pDVar10 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_270);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar10,
                           " to be only used for variables with Input storage class. ",0x39);
                (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                          ((string *)local_260,this,decoration,inst,inst,inst,Max);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar10,(char *)local_260._0_8_,local_260._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar10," ",1);
                (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                          ((string *)(local_250 + 0x18),this,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar10,(char *)CONCAT44(sStack_234,local_250._24_4_),
                           (long)local_230);
                sVar4 = pDVar10->error_;
                if ((spv_parsed_operand_t **)CONCAT44(sStack_234,local_250._24_4_) != local_228) {
                  operator_delete((void *)CONCAT44(sStack_234,local_250._24_4_),
                                  (ulong)((long)&local_228[0]->offset + 1));
                }
                if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)local_250) {
                  operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
                }
                goto LAB_002a3f31;
              }
            }
            goto switchD_002a18c0_caseD_14a8;
          case 0x26:
          case 0x28:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
              _Var2 = (p_Var8[1]._M_parent)->_M_color;
              if (p_Var8[2]._M_color != ~_S_red) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                local_2b0._0_8_ = (spv_operand_desc)0x0;
                sVar4 = AssemblyGrammar::lookupOperand
                                  (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                   (spv_operand_desc *)local_2b0);
                goto LAB_002a200d;
              }
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3055:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3055:13)>
                   ::_M_manager;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateComputeI32InputAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x2a:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2636:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2636:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateVertexIndexAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x2b:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              local_208._8_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1697:13)>
                   ::_M_invoke;
              local_208._0_8_ =
                   std::
                   _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1697:13)>
                   ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar4 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                (*(code *)local_208._0_8_)(&local_218,&local_218,3);
              }
              if (sVar4 != SPV_SUCCESS) {
                return sVar4;
              }
            }
            sVar4 = ValidateInstanceIndexAtReference(this,decoration,inst,inst,inst);
            break;
          default:
            switch(_Var2) {
            case 0x1140:
            case 0x1141:
            case 0x1142:
            case 0x1143:
            case 0x1144:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                if (decoration->dec_type_ != BuiltIn) goto LAB_002a3fa0;
                _Var2 = (p_Var8[1]._M_parent)->_M_color;
                if (p_Var8[2]._M_color == ~_S_red) {
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                  local_208._8_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3183:13)>
                       ::_M_invoke;
                  local_208._0_8_ =
                       std::
                       _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3183:13)>
                       ::_M_manager;
                  sVar4 = ValidateI32Vec(this,decoration,inst,4,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                    (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                  }
                  if (sVar4 != SPV_SUCCESS) {
                    return sVar4;
                  }
                  SVar6 = GetStorageClass((anon_unknown_0 *)
                                          (inst->words_).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (Instruction *)(ulong)(inst->inst_).opcode);
                  if ((SVar6 == Input) || (SVar6 == Max)) goto switchD_002a18c0_caseD_14a8;
                  lVar16 = 8;
                  do {
                    if (*(_Rb_tree_color *)((long)&UINT_00352adc + lVar16) == _Var2) {
                      uVar14 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar16)
                      ;
                      goto LAB_002a3a56;
                    }
                    lVar16 = lVar16 + 0x10;
                  } while (lVar16 != 0x278);
                  uVar14 = 0;
LAB_002a3a56:
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_
                            ((string *)local_2b0,this->_,uVar14,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_2b0._0_8_,
                             local_2b0._8_8_);
                  spvLogStringForEnv_abi_cxx11_((string *)local_290,this->_->context_->target_env);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_290._0_8_,
                             local_290._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data," spec allows BuiltIn ",0x15);
                  local_260._0_8_ = (spv_operand_desc)0x0;
                  sVar4 = AssemblyGrammar::lookupOperand
                                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                     (spv_operand_desc *)local_260);
                  local_270._0_8_ = "Unknown";
                  if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)0x0 &&
                      sVar4 == SPV_SUCCESS) {
                    local_270._0_8_ = *(undefined8 *)local_260._0_8_;
                  }
                  pDVar10 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)local_270);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar10,
                             " to be only used for variables with Input storage class. ",0x39);
                  (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                            ((string *)local_260,this,decoration,inst,inst,inst,Max);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar10,(char *)local_260._0_8_,local_260._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar10," ",1);
                  (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                            ((string *)(local_250 + 0x18),this,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar10,(char *)CONCAT44(sStack_234,local_250._24_4_),
                             (long)local_230);
                  sVar4 = pDVar10->error_;
                  if ((spv_parsed_operand_t **)CONCAT44(sStack_234,local_250._24_4_) != local_228) {
                    operator_delete((void *)CONCAT44(sStack_234,local_250._24_4_),
                                    (ulong)((long)&local_228[0]->offset + 1));
                  }
                  if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)local_250) {
                    operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
                  }
                  if ((code **)local_290._0_8_ != &local_280) {
                    operator_delete((void *)local_290._0_8_,(ulong)((long)local_280 + 1));
                  }
                  if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)local_2a0) {
                    operator_delete((void *)local_2b0._0_8_,local_2a0._0_8_ + 1);
                  }
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                  local_2b0._0_8_ = (spv_operand_desc)0x0;
                  sVar4 = AssemblyGrammar::lookupOperand
                                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                     (spv_operand_desc *)local_2b0);
                  psVar15 = (spv_operand_desc)0x33dcc8;
                  if ((spv_operand_desc)local_2b0._0_8_ != (spv_operand_desc)0x0 &&
                      sVar4 == SPV_SUCCESS) {
                    psVar15 = *(spv_operand_desc *)local_2b0._0_8_;
                  }
                  local_2b0._0_8_ = psVar15;
                  pDVar10 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)local_2b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar10," cannot be used as a member decoration ",0x27);
                  sVar4 = pDVar10->error_;
                }
                goto LAB_002a3654;
              }
            case 0x1145:
            case 0x1146:
            case 0x1147:
            case 0x114b:
            case 0x114c:
            case 0x114d:
            case 0x114e:
            case 0x114f:
            case 0x1151:
            case 0x1152:
            case 0x1153:
            case 0x1154:
            case 0x1155:
            case 0x1157:
            case 0x1159:
            case 0x115a:
            case 0x115b:
              goto switchD_002a18c0_caseD_14a8;
            case 0x1148:
            case 0x1149:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3286:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3286:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateBaseInstanceOrVertexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x114a:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3357:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3357:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateDrawIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1150:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3883:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3883:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidatePrimitiveShadingRateAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1156:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3493:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3493:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateDeviceIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1158:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3428:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3428:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateViewIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x115c:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                local_208._8_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3958:13)>
                     ::_M_invoke;
                local_208._0_8_ =
                     std::
                     _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3958:13)>
                     ::_M_manager;
                sVar4 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if ((ValidationState_t *)local_208._0_8_ != (ValidationState_t *)0x0) {
                  (*(code *)local_208._0_8_)(&local_218,&local_218,3);
                }
                if (sVar4 != SPV_SUCCESS) {
                  return sVar4;
                }
              }
              sVar4 = ValidateShadingRateAtReference(this,decoration,inst,inst,inst);
              break;
            default:
              if (_Var2 - 0x1040 < 5) goto LAB_002a1c07;
              goto switchD_002a18c0_caseD_14a8;
            }
          }
LAB_002a2435:
          if (sVar4 != SPV_SUCCESS) {
            return sVar4;
          }
switchD_002a18c0_caseD_14a8:
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_40);
    } while (p_Var12 != local_38);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBuiltInsAtDefinition() {
  for (const auto& kv : _.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) {
      continue;
    }

    const Instruction* inst = _.FindDef(id);
    assert(inst);

    for (const auto& decoration : kv.second) {
      if (decoration.dec_type() != spv::Decoration::BuiltIn) {
        continue;
      }

      if (spv_result_t error =
              ValidateSingleBuiltInAtDefinition(decoration, *inst)) {
        return error;
      }
    }
  }

  return SPV_SUCCESS;
}